

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::InvalidateDefaultSubFramebufferRenderCase::render
          (InvalidateDefaultSubFramebufferRenderCase *this,Surface *dst)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Context *pCVar6;
  size_type sVar7;
  reference attachments_00;
  ContextWrapper *this_00;
  Vector<float,_3> local_1f8;
  Vector<float,_3> local_1ec;
  Vector<float,_4> local_1e0;
  Vector<float,_3> local_1d0;
  Vector<float,_3> local_1c4;
  Vector<float,_4> local_1b8;
  deUint32 local_1a8;
  deUint32 flatShaderID;
  undefined1 local_198 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  FlatColorShader flatShader;
  int invalidateH;
  int invalidateW;
  int invalidateY;
  int invalidateX;
  Surface *dst_local;
  InvalidateDefaultSubFramebufferRenderCase *this_local;
  
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  iVar2 = sglr::ContextWrapper::getWidth(this_00);
  if (iVar2 < 0) {
    iVar2 = iVar2 + 3;
  }
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  if (iVar3 < 0) {
    iVar3 = iVar3 + 3;
  }
  iVar4 = sglr::ContextWrapper::getWidth(this_00);
  iVar5 = sglr::ContextWrapper::getHeight(this_00);
  FboTestUtil::FlatColorShader::FlatColorShader
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TYPE_FLOAT_VEC4);
  getDefaultFBDiscardAttachments
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198,this->m_buffers);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  local_1a8 = (*pCVar6->_vptr_Context[0x75])
                        (pCVar6,&attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,0x4500);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,1,0xff);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_1a8;
  tcu::Vector<float,_4>::Vector(&local_1b8,1.0,0.0,0.0,1.0);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar6,dVar1,&local_1b8);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_1a8;
  tcu::Vector<float,_3>::Vector(&local_1c4,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_1d0,1.0,1.0,1.0);
  sglr::drawQuad(pCVar6,dVar1,&local_1c4,&local_1d0);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198);
  attachments_00 =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198,0);
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,(int)sVar7,attachments_00,
             iVar2 >> 2,iVar3 >> 2,iVar4 / 2,iVar5 / 2);
  sglr::ContextWrapper::glClearColor
            (&(this->super_FboTestCase).super_ContextWrapper,0.0,1.0,0.0,1.0);
  sglr::ContextWrapper::glClearStencil(&(this->super_FboTestCase).super_ContextWrapper,1);
  sglr::ContextWrapper::glScissor
            (&(this->super_FboTestCase).super_ContextWrapper,iVar2 >> 2,iVar3 >> 2,iVar4 / 2,
             iVar5 / 2);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xc11);
  sglr::ContextWrapper::glClear(&(this->super_FboTestCase).super_ContextWrapper,this->m_buffers);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xc11);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xbe2);
  sglr::ContextWrapper::glBlendFunc(&(this->super_FboTestCase).super_ContextWrapper,1,1);
  sglr::ContextWrapper::glBlendEquation(&(this->super_FboTestCase).super_ContextWrapper,0x8006);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_1a8;
  tcu::Vector<float,_4>::Vector(&local_1e0,0.0,0.0,1.0,1.0);
  FboTestUtil::FlatColorShader::setColor
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pCVar6,dVar1,&local_1e0);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar1 = local_1a8;
  tcu::Vector<float,_3>::Vector(&local_1ec,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_1f8,1.0,1.0,0.0);
  sglr::drawQuad(pCVar6,dVar1,&local_1ec,&local_1f8);
  iVar2 = sglr::ContextWrapper::getWidth(&(this->super_FboTestCase).super_ContextWrapper);
  iVar3 = sglr::ContextWrapper::getHeight(&(this->super_FboTestCase).super_ContextWrapper);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,iVar2,iVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198);
  FboTestUtil::FlatColorShader::~FlatColorShader
            ((FlatColorShader *)
             &attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		int					invalidateX		= getWidth()	/ 4;
		int					invalidateY		= getHeight()	/ 4;
		int					invalidateW		= getWidth()	/ 2;
		int					invalidateH		= getHeight()	/ 2;
		FlatColorShader		flatShader		(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>	attachments		= getDefaultFBDiscardAttachments(m_buffers);
		deUint32			flatShaderID	= getCurrentContext()->createProgram(&flatShader);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		// Clear invalidated buffers.
		glClearColor	(0.0f, 1.0f, 0.0f, 1.0f);
		glClearStencil	(1);
		glScissor		(invalidateX, invalidateY, invalidateW, invalidateH);
		glEnable		(GL_SCISSOR_TEST);
		glClear			(m_buffers);
		glDisable		(GL_SCISSOR_TEST);

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}